

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-util.cc
# Opt level: O1

Label * __thiscall wabt::ModuleContext::GetLabel(ModuleContext *this,Var *var)

{
  pointer pLVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  uint uVar4;
  Label *unaff_RBX;
  Label *pLVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  if (var->type_ == Index) {
    pLVar1 = (this->label_stack_).super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (int)((ulong)((long)(this->label_stack_).
                                super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pLVar1) >> 3) *
            -0x45d1745d;
    if ((var->field_2).index_ < uVar4) {
      return pLVar1 + (uVar4 + ~(var->field_2).index_);
    }
  }
  else {
    if (var->type_ != Name) {
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                    ,0x3a,"Index wabt::Var::index() const");
    }
    pLVar1 = (this->label_stack_).super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>.
             _M_impl.super__Vector_impl_data._M_start;
    __s2 = (var->field_2).name_._M_dataplus._M_p;
    sVar2 = (var->field_2).name_._M_string_length;
    lVar6 = (ulong)(uint)((int)((ulong)((long)(this->label_stack_).
                                              super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pLVar1) >> 3) * -0x45d1745d) * 0x58;
    do {
      lVar7 = lVar6 + -0x58;
      pLVar5 = unaff_RBX;
      if (lVar7 == -0x58) break;
      pLVar5 = (Label *)((long)&pLVar1[-1].name._M_dataplus._M_p + lVar6);
      __n = *(size_t *)((long)pLVar1 + lVar6 + -0x50);
      if (__n == sVar2) {
        if (__n == 0) {
          bVar8 = true;
        }
        else {
          iVar3 = bcmp((pLVar5->name)._M_dataplus._M_p,__s2,__n);
          bVar8 = iVar3 == 0;
        }
      }
      else {
        bVar8 = false;
      }
      lVar6 = lVar7;
    } while (!bVar8);
    if (lVar7 != -0x58) {
      return pLVar5;
    }
  }
  return (Label *)0x0;
}

Assistant:

Index ModuleContext::GetLabelArity(const Var& var) const {
  auto label = GetLabel(var);
  if (!label) {
    return 0;
  }

  return label->label_type == LabelType::Loop ? label->param_types.size()
                                              : label->result_types.size();
}